

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  int *piVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  bVar2 = instr->dst;
  iVar6 = this->codePos;
  iVar7 = ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)this->registerUsage[bVar2] + 1] - iVar6) + -0x10;
  if ((BranchesWithin32B == '\x01') &&
     (0x1f < (iVar6 + (uint)(iVar7 < -0x80) * 4 + 0x10 ^ iVar6 + 7U))) {
    uVar8 = 0x20 - (iVar6 + 7U & 0x1f);
    iVar7 = iVar7 - uVar8;
    memcpy(this->code + iVar6,&JMP_ALIGN_PREFIX + uVar8 * 0x10,(ulong)uVar8);
    this->codePos = this->codePos + uVar8;
  }
  puVar3 = this->code;
  iVar6 = this->codePos;
  (puVar3 + iVar6)[0] = 'I';
  (puVar3 + iVar6)[1] = 0x81;
  iVar6 = this->codePos + 2;
  this->codePos = iVar6;
  uVar4 = bVar2 - 0x40;
  this->code[iVar6] = uVar4;
  iVar6 = this->codePos;
  this->codePos = iVar6 + 1;
  bVar2 = instr->mod >> 4;
  *(uint32_t *)(this->code + (long)iVar6 + 1) = ~(0x80 << bVar2) & (0x100 << bVar2 | instr->imm32);
  iVar6 = this->codePos + 4;
  this->codePos = iVar6;
  puVar3 = this->code;
  (puVar3 + iVar6)[0] = 'I';
  (puVar3 + iVar6)[1] = 0xf7;
  iVar6 = this->codePos + 2;
  this->codePos = iVar6;
  this->code[iVar6] = uVar4;
  iVar6 = this->codePos;
  this->codePos = iVar6 + 1;
  *(int *)(this->code + (long)iVar6 + 1) = 0xff00 << bVar2;
  iVar6 = this->codePos + 4;
  this->codePos = iVar6;
  if (iVar7 < -0x80) {
    puVar3 = this->code + iVar6;
    puVar3[0] = '\x0f';
    puVar3[1] = 0x84;
    iVar6 = this->codePos + 2;
    this->codePos = iVar6;
    *(int *)(this->code + iVar6) = iVar7 + -4;
    iVar6 = 4;
  }
  else {
    this->code[iVar6] = 't';
    iVar6 = this->codePos;
    this->codePos = iVar6 + 1;
    this->code[(long)iVar6 + 1] = (uint8_t)iVar7;
    iVar6 = 1;
  }
  this->codePos = this->codePos + iVar6;
  lVar5 = 0;
  do {
    piVar1 = this->registerUsage + lVar5;
    *piVar1 = i;
    piVar1[1] = i;
    piVar1[2] = i;
    piVar1[3] = i;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 8);
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;

		int32_t jmp_offset = instructionOffsets[target] - (codePos + 16);

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos + 7);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + ((jmp_offset >= -128) ? 9 : 13));

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				const uint32_t alignment_size = 32 - (branch_begin & 31);
				jmp_offset -= alignment_size;
				emit(JMP_ALIGN_PREFIX[alignment_size], alignment_size);
			}
		}

		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		const int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);

		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);

		if (jmp_offset >= -128) {
			emitByte(JZ_SHORT);
			emitByte(jmp_offset);
		}
		else {
			emit(JZ);
			emit32(jmp_offset - 4);
		}

		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}